

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O0

ssize_t __thiscall xmrig::Client::send(Client *this,int __fd,void *__buf,size_t __n,int __flags)

{
  SocketState SVar1;
  int iVar2;
  long lVar3;
  undefined7 uVar4;
  undefined4 in_register_00000034;
  undefined1 *puVar5;
  bool result;
  uv_buf_t buf;
  bool local_29;
  undefined1 local_28 [8];
  long local_20;
  BIO *local_18;
  Client *local_10;
  bool local_1;
  
  local_18 = (BIO *)CONCAT44(in_register_00000034,__fd);
  local_10 = this;
  local_20 = BIO_ctrl(local_18,3,0,local_28);
  if (local_20 == 0) {
    local_1 = true;
    uVar4 = 0;
  }
  else {
    local_29 = false;
    SVar1 = state(this);
    if ((SVar1 == ConnectedState) && (iVar2 = uv_is_writable(this->m_stream), iVar2 != 0)) {
      puVar5 = local_28;
      iVar2 = uv_try_write(this->m_stream,puVar5,1);
      local_29 = 0 < iVar2;
      if (!local_29) {
        close(this,(int)puVar5);
      }
    }
    lVar3 = BIO_ctrl(local_18,1,0,(void *)0x0);
    uVar4 = (undefined7)((ulong)lVar3 >> 8);
    local_1 = local_29;
  }
  return CONCAT71(uVar4,local_1);
}

Assistant:

bool xmrig::Client::send(BIO *bio)
{
#   ifdef XMRIG_FEATURE_TLS
    uv_buf_t buf;
    buf.len = BIO_get_mem_data(bio, &buf.base);

    if (buf.len == 0) {
        return true;
    }

    LOG_DEBUG("[%s] TLS send     (%d bytes)", url(), static_cast<int>(buf.len));

    bool result = false;
    if (state() == ConnectedState && uv_is_writable(m_stream)) {
        result = uv_try_write(m_stream, &buf, 1) > 0;

        if (!result) {
            close();
        }
    }
    else {
        LOG_DEBUG_ERR("[%s] send failed, invalid state: %d", url(), m_state);
    }

    (void) BIO_reset(bio);

    return result;
#   else
    return false;
#   endif
}